

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransport.h
# Opt level: O3

void __thiscall
apache::thrift::transport::
TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
::write_virt(TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
             *this,uint8_t *buf,uint32_t len)

{
  sendto(*(int *)((long)&this[1].super_TTransportDefaults.super_TTransport._vptr_TTransport + 4),buf
         ,(ulong)len,0,(sockaddr *)(this + 0x14),
         *(socklen_t *)&this[0x24].super_TTransportDefaults.super_TTransport._vptr_TTransport);
  return;
}

Assistant:

void write(const uint8_t* buf, uint32_t len)
    {
        ::sendto(_socket.handle(),
#ifdef WIN32
            reinterpret_cast<const char*>(buf),  // this cast is safe
#else
            buf,
#endif
            len,
            0,
            reinterpret_cast<const ::sockaddr*>(&_clientAddr.addr()),
            _clientAddr.addrLen());
    }